

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcSC3DMCEncoder.h
# Opt level: O3

void __thiscall
o3dgc::SC3DMCEncoder<unsigned_short>::~SC3DMCEncoder(SC3DMCEncoder<unsigned_short> *this)

{
  long *plVar1;
  
  if (this->m_normals != (Real *)0x0) {
    operator_delete__(this->m_normals);
  }
  if (this->m_quantFloatArray != (long *)0x0) {
    operator_delete__(this->m_quantFloatArray);
  }
  if (this->m_bufferAC != (uchar *)0x0) {
    operator_delete__(this->m_bufferAC);
  }
  plVar1 = (this->m_predictors).m_buffer;
  if (plVar1 != (long *)0x0) {
    operator_delete__(plVar1);
  }
  TriangleListEncoder<unsigned_short>::~TriangleListEncoder(&this->m_triangleListEncoder);
  return;
}

Assistant:

~SC3DMCEncoder(void)
                                    {
                                        delete [] m_normals;
                                        delete [] m_quantFloatArray;
                                        delete [] m_bufferAC;
                                    }